

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage,_std::nullptr_t>_>_> __thiscall
capnp::TwoPartyVatNetwork::receiveIncomingMessage(TwoPartyVatNetwork *this)

{
  Type local_20 [2];
  TwoPartyVatNetwork *this_local;
  
  this_local = this;
  kj::evalLater<capnp::TwoPartyVatNetwork::receiveIncomingMessage()::__0>((kj *)this,local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> TwoPartyVatNetwork::receiveIncomingMessage() {
  return kj::evalLater([this]() -> kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> {
    KJ_IF_SOME(e, readCancelReason) {
      // A previous write failed; propagate the failure to reads, too.
      return kj::cp(e);
    }

    kj::Array<kj::OwnFd> fdSpace = nullptr;
    if(maxFdsPerMessage > 0) {
      fdSpace = kj::heapArray<kj::OwnFd>(maxFdsPerMessage);
    }
    auto promise = readCanceler.wrap(getStream().tryReadMessage(fdSpace, receiveOptions));
    return promise.then([fdSpace = kj::mv(fdSpace)]
                        (kj::Maybe<MessageReaderAndFds>&& messageAndFds) mutable
                      -> kj::Maybe<kj::Own<IncomingRpcMessage>> {
      KJ_IF_SOME(m, messageAndFds) {
        if (m.fds.size() > 0) {
          return kj::Own<IncomingRpcMessage>(
              kj::heap<IncomingMessageImpl>(kj::mv(m), kj::mv(fdSpace)));
        } else {
          return kj::Own<IncomingRpcMessage>(kj::heap<IncomingMessageImpl>(kj::mv(m.reader)));
        }
      } else {
        return kj::none;
      }
    });
  });
}